

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O1

void __thiscall Assimp::ObjFileParser::getObjectName(ObjFileParser *this)

{
  byte *pbVar1;
  pointer ppOVar2;
  Object *pOVar3;
  size_t __n;
  bool bVar4;
  _Alloc_hider __s2;
  int iVar5;
  byte *pbVar6;
  pointer ppOVar7;
  byte *pbVar8;
  string strObjectName;
  string local_58;
  Model *local_38;
  
  pbVar8 = (byte *)(this->m_DataIt)._M_current;
  pbVar1 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar6 = pbVar1 + -1;
  bVar4 = pbVar6 == pbVar8 || pbVar8 == pbVar1;
  if (pbVar6 != pbVar8 && pbVar8 != pbVar1) {
    do {
      if (((ulong)*pbVar8 < 0x21) && ((0x100003601U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0)) {
        if (!bVar4) goto LAB_0046fbe6;
        break;
      }
      pbVar8 = pbVar8 + 1;
      bVar4 = pbVar8 == pbVar6 || pbVar8 == pbVar1;
    } while (pbVar8 != pbVar6 && pbVar8 != pbVar1);
  }
  goto LAB_0046fc00;
  while (pbVar8 != pbVar6) {
LAB_0046fbe6:
    if (((*pbVar8 != 0x20) && (*pbVar8 != 9)) || (pbVar8 = pbVar8 + 1, pbVar8 == pbVar1)) break;
  }
LAB_0046fc00:
  (this->m_DataIt)._M_current = (char *)pbVar8;
  if (pbVar8 != pbVar1) {
    pbVar6 = (byte *)(this->m_DataIt)._M_current;
    while ((pbVar6 != pbVar1 &&
           ((0x20 < (ulong)*pbVar6 || ((0x100003601U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0))))) {
      pbVar6 = pbVar6 + 1;
      (this->m_DataIt)._M_current = (char *)pbVar6;
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_58);
    __s2._M_p = local_58._M_dataplus._M_p;
    if (local_58._M_string_length != 0) {
      ((this->m_pModel)._M_t.
       super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>.
       _M_t.
       super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
       .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrent =
           (Object *)0x0;
      local_38 = (this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      ppOVar2 = *(pointer *)
                 ((long)&(local_38->m_Objects).
                         super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                 + 8);
      for (ppOVar7 = *(pointer *)
                      &(local_38->m_Objects).
                       super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                       ._M_impl; ppOVar7 != ppOVar2; ppOVar7 = ppOVar7 + 1) {
        pOVar3 = *ppOVar7;
        __n = (pOVar3->m_strObjName)._M_string_length;
        if ((__n == local_58._M_string_length) &&
           ((__n == 0 ||
            (iVar5 = bcmp((pOVar3->m_strObjName)._M_dataplus._M_p,__s2._M_p,__n), iVar5 == 0)))) {
          local_38->m_pCurrent = pOVar3;
          break;
        }
      }
      if (((this->m_pModel)._M_t.
           super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
           .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrent ==
          (Object *)0x0) {
        createObject(this,&local_58);
      }
    }
    pbVar6 = (byte *)(this->m_DataIt)._M_current;
    pbVar8 = (byte *)(this->m_DataItEnd)._M_current;
    if (pbVar8 + -1 != pbVar6 && pbVar6 != pbVar8) {
      do {
        if (((*pbVar6 < 0xe) && ((0x3401U >> (*pbVar6 & 0x1f) & 1) != 0)) ||
           (pbVar6 = pbVar6 + 1, pbVar6 == pbVar8)) break;
      } while (pbVar6 != pbVar8 + -1);
    }
    pbVar1 = pbVar6;
    if (pbVar6 != pbVar8) {
      pbVar6 = pbVar6 + 1;
      this->m_uiLine = this->m_uiLine + 1;
      pbVar1 = pbVar6;
    }
    for (; (pbVar1 != pbVar8 && ((*pbVar1 == 0x20 || (pbVar6 = pbVar1, *pbVar1 == 9))));
        pbVar1 = pbVar1 + 1) {
      pbVar6 = pbVar8;
    }
    (this->m_DataIt)._M_current = (char *)pbVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void ObjFileParser::getObjectName()
{
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
    if( m_DataIt == m_DataItEnd ) {
        return;
    }
    char *pStart = &(*m_DataIt);
    while( m_DataIt != m_DataItEnd && !IsSpaceOrNewLine( *m_DataIt ) ) {
        ++m_DataIt;
    }

    std::string strObjectName(pStart, &(*m_DataIt));
    if (!strObjectName.empty())
    {
        // Reset current object
        m_pModel->m_pCurrent = NULL;

        // Search for actual object
        for (std::vector<ObjFile::Object*>::const_iterator it = m_pModel->m_Objects.begin();
            it != m_pModel->m_Objects.end();
            ++it)
        {
            if ((*it)->m_strObjName == strObjectName)
            {
                m_pModel->m_pCurrent = *it;
                break;
            }
        }

        // Allocate a new object, if current one was not found before
        if( NULL == m_pModel->m_pCurrent ) {
            createObject( strObjectName );
        }
    }
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}